

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

VRIntArray * __thiscall
MinVR::VRDatumInt::getValueIntArray(VRIntArray *__return_storage_ptr__,VRDatumInt *this)

{
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,(iterator)0x0,
             (int *)((this->super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>).value.
                     super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                     super__List_node_base._M_next + 1));
  return __return_storage_ptr__;
}

Assistant:

VRIntArray getValueIntArray() const {
    VRIntArray out;  out.push_back(value.front());  return out; }